

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool ICM::Parser::createAST(Match *match,AST *ast,ElementPool *EP)

{
  uint uVar1;
  MatchType type;
  char *__format;
  bool bVar2;
  bool bVar3;
  Element EVar4;
  MatchResult mr;
  MatchResult local_88;
  MatchResult local_68;
  ElementPool *local_48;
  anon_union_4_2_4727c1b0_for_Element_0 local_40 [2];
  uint_t local_38;
  
  local_48 = EP;
  Match::matchNext(&local_88,match);
  do {
    switch(local_88._0_8_ & 0xffffffff) {
    case 0:
    case 2:
      if (CONCAT44(local_88.beginPtr._4_4_,local_88.beginPtr._0_4_) ==
          CONCAT44(local_88.endPtr._4_4_,local_88.endPtr._0_4_)) {
        return false;
      }
      Match::matchNext(&local_68,match);
      local_88._0_8_ = CONCAT44(local_68._4_4_,local_68.type);
      local_88.endPtr._0_4_ = local_68.endPtr._0_4_;
      local_88.endPtr._4_4_ = local_68.endPtr._4_4_;
      local_88.addmsg = local_68.addmsg;
      local_88.beginPtr._0_4_ = local_68.beginPtr._0_4_;
      local_88.beginPtr._4_4_ = local_68.beginPtr._4_4_;
      break;
    default:
      goto switchD_0013d181_caseD_1;
    case 3:
    case 5:
      bVar3 = false;
      bVar2 = false;
      goto LAB_0013d1be;
    }
  } while( true );
LAB_0013d1be:
  if (CONCAT44(local_88.beginPtr._4_4_,local_88.beginPtr._0_4_) ==
      CONCAT44(local_88.endPtr._4_4_,local_88.endPtr._0_4_)) goto LAB_0013d2c0;
  MatchResult::getString_abi_cxx11_((string *)&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  type = local_88.type;
  switch(local_88.type) {
  case MT_LBracket:
    AST::pushNode(ast);
    bVar3 = true;
    goto LAB_0013d273;
  case MT_RBracket:
    if (bVar3) {
      local_68.type = match->linenum;
      println<char[23],unsigned_int,char[3]>
                ((char (*) [23])"Unfind Method in Line(",&local_68.type,(char (*) [3])").");
      return false;
    }
    AST::retNode(ast);
    goto LAB_0013d234;
  case MT_LSBracket:
    AST::pushNode(ast);
    local_68.type = 0x1904;
    local_68.beginPtr._0_4_ = 0;
    local_68.beginPtr._4_4_ = 0;
    AST::pushData(ast,(Element *)&local_68);
    bVar3 = false;
    goto LAB_0013d273;
  case MT_RSBracket:
    AST::retNode(ast);
    break;
  case MT_Identifier:
  case MT_Keyword:
  case MT_Boolean:
  case MT_Number:
  case MT_String:
    MatchResult::getString_abi_cxx11_((string *)&local_68,&local_88);
    EVar4 = createElementData(type,(string *)&local_68,local_48);
    local_38 = EVar4.index;
    local_40[0] = EVar4.field_0;
    AST::pushData(ast,(Element *)&local_40[0].field_0);
    std::__cxx11::string::~string((string *)&local_68);
LAB_0013d234:
    bVar3 = false;
  }
  if (bVar2) {
LAB_0013d273:
    bVar2 = true;
    if ((ast->farthptrs).c.
        super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (ast->farthptrs).c.
        super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) goto LAB_0013d2c0;
  }
  else {
    bVar2 = false;
  }
  Match::matchNext(&local_68,match);
  local_88._0_8_ = CONCAT44(local_68._4_4_,local_68.type);
  local_88.endPtr._0_4_ = local_68.endPtr._0_4_;
  local_88.endPtr._4_4_ = local_68.endPtr._4_4_;
  local_88.addmsg = local_68.addmsg;
  local_88.beginPtr._0_4_ = local_68.beginPtr._0_4_;
  local_88.beginPtr._4_4_ = local_68.beginPtr._4_4_;
  goto LAB_0013d1be;
switchD_0013d181_caseD_1:
  uVar1 = match->linenum;
  __format = "Syntax Error in line(%d).\n";
  goto LAB_0013d2ef;
LAB_0013d2c0:
  if ((long)(ast->Table).
            super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(ast->Table).
            super__Vector_base<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    return false;
  }
  if ((ast->farthptrs).c.
      super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (ast->farthptrs).c.
      super__Deque_base<ICM::ASTBase::Node_*,_std::allocator<ICM::ASTBase::Node_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    return true;
  }
  uVar1 = match->linenum;
  __format = "Error match \')\' in line(%d).\n";
LAB_0013d2ef:
  printf(__format,(ulong)uVar1);
  return false;
}

Assistant:

bool createAST(Match &match, AST &ast, Compiler::ElementPool &EP)
		{
			MatchResult mr = match.matchNext();

			// Check Unmatch
			while (mr.getType() == MT_Null || mr.getType() == MT_Comment) {
				if (mr.begin() != mr.end())
					mr = match.matchNext();
				else
					return false;
			}
			if (mr.getType() != MT_LBracket && mr.getType() != MT_LSBracket) {
				printf("Syntax Error in line(%d).\n", match.getCurLineNum());
				return false;
			}

			// Start Match
			bool firstMatchBraket = false;
			bool emptybreak = false;

			while (mr.begin() != mr.end()) {

				if (mr.getString()[0] != '\n') {
					//println(mr);
				}

				switch (mr.getType()) {
				case MT_LBracket:
					ast.pushNode();
					firstMatchBraket = true;
					emptybreak = true;
					break;
				case MT_RBracket:
					if (firstMatchBraket) {
						println("Unfind Method in Line(", match.getCurLineNum(), ").");
						return false;
					}
					ast.retNode();
					break;
				case MT_LSBracket:
					ast.pushNode();
					ast.pushData(AST::Element::Keyword(Keyword::list_));
					firstMatchBraket = false;
					emptybreak = true;
					break;
				case MT_RSBracket:
					ast.retNode();
					break;
				case MT_Identifier: case MT_Keyword:
				case MT_Number: case MT_String: case MT_Boolean:
					//if (firstMatchBraket) {
					//	printf("Error '%s' is not function in line(%d).\n", mr.getString().c_str(), match.getCurLineNum());
					//	return false;
					//}
					ast.pushData(createElementData(mr.getType(), mr.getString(), EP));
					firstMatchBraket = false;
					break;
				default:
					break;
				}

				if (emptybreak && ast.isend()) {
					break;
				}
				mr = match.matchNext();
			}

			if (ast.empty())
				return false;

			if (!ast.isend()) {
				printf("Error match ')' in line(%d).\n", match.getCurLineNum());
				return false;
			}
			return true;
		}